

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  XmlWriter *writer;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long lVar3;
  ScopedElement scoped;
  ScopedElement e;
  string local_80;
  ScopedElement local_60;
  string local_50;
  ScopedElement local_30;
  
  Option<Catch::TestCaseInfo>::reset
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestCaseInfo.
              super_Option<Catch::TestCaseInfo>);
  (this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestCaseInfo.used = false;
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"OverallResult","");
  writer = &this->m_xml;
  XmlWriter::ScopedElement::ScopedElement(&local_30,writer,Newline|Indent);
  XmlWriter::startElement(writer,&local_80,Newline|Indent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"success","");
  XmlWriter::writeAttribute
            (local_30.m_writer,&local_80,(testCaseStats->totals).assertions.failed == 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  iVar2 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar2 == 1) {
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"durationInSeconds","");
    lVar3 = std::chrono::_V2::system_clock::now();
    local_50._M_dataplus._M_p =
         (pointer)((double)((lVar3 - (this->m_testCaseTimer).m_nanoseconds) / 1000) / 1000000.0);
    XmlWriter::writeAttribute<double>(local_30.m_writer,&local_80,(double *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((testCaseStats->stdOut)._M_string_length != 0) {
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"StdOut","");
    XmlWriter::ScopedElement::ScopedElement(&local_60,writer,Newline|Indent);
    XmlWriter::startElement(writer,&local_80,Newline|Indent);
    trim(&local_50,&testCaseStats->stdOut);
    XmlWriter::writeText(local_60.m_writer,&local_50,Newline);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    XmlWriter::ScopedElement::~ScopedElement(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((testCaseStats->stdErr)._M_string_length != 0) {
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"StdErr","");
    XmlWriter::ScopedElement::ScopedElement(&local_60,writer,Newline|Indent);
    XmlWriter::startElement(writer,&local_80,Newline|Indent);
    trim(&local_50,&testCaseStats->stdErr);
    XmlWriter::writeText(local_60.m_writer,&local_50,Newline);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    XmlWriter::ScopedElement::~ScopedElement(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  XmlWriter::endElement(writer,Newline|Indent);
  XmlWriter::ScopedElement::~ScopedElement(&local_30);
  return;
}

Assistant:

void XmlReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        StreamingReporterBase::testCaseEnded( testCaseStats );
        XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
        e.writeAttribute( "success", testCaseStats.totals.assertions.allOk() );

        if ( m_config->showDurations() == ShowDurations::Always )
            e.writeAttribute( "durationInSeconds", m_testCaseTimer.getElapsedSeconds() );

        if( !testCaseStats.stdOut.empty() )
            m_xml.scopedElement( "StdOut" ).writeText( trim( testCaseStats.stdOut ), XmlFormatting::Newline );
        if( !testCaseStats.stdErr.empty() )
            m_xml.scopedElement( "StdErr" ).writeText( trim( testCaseStats.stdErr ), XmlFormatting::Newline );

        m_xml.endElement();
    }